

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnCatchExpr
          (BinaryReaderInterp *this,Index tag_index)

{
  pointer *ppCVar1;
  uint uVar2;
  int iVar3;
  State *pSVar4;
  pointer pLVar5;
  pointer pLVar6;
  pointer pHVar7;
  pointer pLVar8;
  iterator __position;
  Result RVar9;
  Enum EVar10;
  Offset OVar11;
  long lVar12;
  Location loc;
  Location loc_1;
  Location local_b8;
  Location local_98;
  Var local_78;
  
  local_b8.field_1.field_0.last_column = 0;
  local_b8.filename._M_len = (this->filename_)._M_len;
  local_b8.filename._M_str = (this->filename_)._M_str;
  pSVar4 = (this->super_BinaryReaderNop).super_BinaryReaderDelegate.state;
  local_b8.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)pSVar4->offset;
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = (this->filename_)._M_len;
  local_98.filename._M_str = (this->filename_)._M_str;
  local_98.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)pSVar4->offset;
  Var::Var(&local_78,tag_index,&local_98);
  RVar9 = SharedValidator::OnCatch(&this->validator_,&local_b8,&local_78,false);
  Var::~Var(&local_78);
  EVar10 = Error;
  if (RVar9.enum_ != Error) {
    pLVar5 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar6 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar12 = (long)pLVar6 - (long)pLVar5;
    if (lVar12 == 0) {
      __assert_fail("depth < label_stack_.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                    ,0x186,
                    "Label *wabt::interp::(anonymous namespace)::BinaryReaderInterp::GetLabel(Index)"
                   );
    }
    uVar2 = pLVar6[-1].handler_desc_index;
    pHVar7 = (this->func_->handlers).
             super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pHVar7[uVar2].kind = Catch;
    if (pLVar6[-1].kind == Block) {
      Istream::EmitCatchDrop(this->istream_,1);
    }
    iVar3 = *(int *)((long)pLVar5 + lVar12 + -0xc);
    Istream::Emit(this->istream_,Br);
    if (iVar3 != -1) {
      __assert_fail("offset == Istream::kInvalidOffset",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                    ,0x68b,
                    "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::OnCatchExpr(Index)"
                   );
    }
    pLVar6 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pLVar8 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_start;
    OVar11 = Istream::end(this->istream_);
    FixupMap::Append(&this->depth_fixups_,(int)((ulong)((long)pLVar6 - (long)pLVar8) >> 4) - 1,
                     OVar11);
    Istream::Emit(this->istream_,0xffffffff);
    if (pHVar7[uVar2].try_end_offset == 0xffffffff) {
      OVar11 = Istream::end(this->istream_);
      pHVar7[uVar2].try_end_offset = OVar11;
    }
    *(undefined4 *)((long)pLVar5 + lVar12 + -0x10) = 0;
    local_b8.filename._M_len = CONCAT44(local_b8.filename._M_len._4_4_,tag_index);
    OVar11 = Istream::end(this->istream_);
    local_b8.filename._M_len = CONCAT44(OVar11,(undefined4)local_b8.filename._M_len);
    local_b8.filename._M_str = (char *)((ulong)local_b8.filename._M_str & 0xffffffffffffff00);
    __position._M_current =
         *(pointer *)
          ((long)&pHVar7[uVar2].catches.
                  super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                  ._M_impl + 8);
    if (__position._M_current ==
        *(pointer *)
         ((long)&pHVar7[uVar2].catches.
                 super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                 ._M_impl + 0x10)) {
      std::vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>::
      _M_realloc_insert<wabt::interp::CatchDesc>
                (&pHVar7[uVar2].catches,__position,(CatchDesc *)&local_b8);
    }
    else {
      *(undefined4 *)&(__position._M_current)->ref = local_b8.filename._M_str._0_4_;
      (__position._M_current)->tag_index = (undefined4)local_b8.filename._M_len;
      (__position._M_current)->offset = OVar11;
      ppCVar1 = (pointer *)
                ((long)&pHVar7[uVar2].catches.
                        super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                        ._M_impl + 8);
      *ppCVar1 = *ppCVar1 + 1;
    }
    EVar10 = Ok;
  }
  return (Result)EVar10;
}

Assistant:

Result BinaryReaderInterp::OnCatchExpr(Index tag_index) {
  CHECK_RESULT(
      validator_.OnCatch(GetLocation(), Var(tag_index, GetLocation()), false));
  Label* label = TopLabel();
  HandlerDesc& desc = func_->handlers[label->handler_desc_index];
  desc.kind = HandlerKind::Catch;
  // Drop the previous block's exception if it was a catch.
  if (label->kind == LabelKind::Block) {
    istream_.EmitCatchDrop(1);
  }
  // Jump to the end of the block at the end of the previous try or catch.
  Istream::Offset offset = label->offset;
  istream_.Emit(Opcode::Br);
  assert(offset == Istream::kInvalidOffset);
  depth_fixups_.Append(label_stack_.size() - 1, istream_.end());
  istream_.Emit(offset);
  // The offset is only set after the first catch block, as the offset range
  // should only cover the try block itself.
  if (desc.try_end_offset == Istream::kInvalidOffset) {
    desc.try_end_offset = istream_.end();
  }
  // The label kind is switched to Block from Try in order to distinguish
  // catch blocks from try blocks. This is used to ensure that a try-delegate
  // inside this catch will not delegate to the catch, and instead find outer
  // try blocks to use as a delegate target.
  label->kind = LabelKind::Block;
  desc.catches.push_back(CatchDesc{tag_index, istream_.end()});
  return Result::Ok;
}